

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O0

void extendText(vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                *result,const_iterator it)

{
  char *start;
  bool bVar1;
  int iVar2;
  reference ppcVar3;
  TextContent *pTVar4;
  pointer pcVar5;
  bool bVar6;
  TextContent *local_60 [3];
  TextContent *local_48;
  TextContent *textContent_1;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_38;
  TextContent *local_30;
  TextContent *textContent;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_20;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *local_18;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *result_local;
  const_iterator it_local;
  
  local_18 = result;
  result_local = (vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  *)it._M_current;
  bVar1 = std::
          vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
          ::empty(result);
  bVar6 = false;
  if (!bVar1) {
    textContent = (TextContent *)
                  std::
                  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  ::end(local_18);
    local_20 = __gnu_cxx::
               __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
               ::operator-((__normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                            *)&textContent,1);
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
              ::operator*(&local_20);
    iVar2 = (*(*ppcVar3)->_vptr_cmGeneratorExpressionEvaluator[2])();
    bVar6 = iVar2 == 0;
  }
  if (bVar6) {
    textContent_1 =
         (TextContent *)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::end(local_18);
    local_38 = __gnu_cxx::
               __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
               ::operator-((__normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                            *)&textContent_1,1);
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
              ::operator*(&local_38);
    pTVar4 = (TextContent *)*ppcVar3;
    local_30 = pTVar4;
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->((__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                           *)&result_local);
    TextContent::Extend(pTVar4,pcVar5->Length);
  }
  else {
    pTVar4 = (TextContent *)operator_new(0x18);
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->((__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                           *)&result_local);
    start = pcVar5->Content;
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->((__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                           *)&result_local);
    TextContent::TextContent(pTVar4,start,pcVar5->Length);
    local_60[0] = pTVar4;
    local_48 = pTVar4;
    std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
    ::push_back(local_18,(value_type *)local_60);
  }
  return;
}

Assistant:

static void extendText(
  std::vector<cmGeneratorExpressionEvaluator*>& result,
  std::vector<cmGeneratorExpressionToken>::const_iterator it)
{
  if (!result.empty() &&
      (*(result.end() - 1))->GetType() ==
        cmGeneratorExpressionEvaluator::Text) {
    TextContent* textContent = static_cast<TextContent*>(*(result.end() - 1));
    textContent->Extend(it->Length);
  } else {
    TextContent* textContent = new TextContent(it->Content, it->Length);
    result.push_back(textContent);
  }
}